

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall
tchecker::system::system_t::add_edge
          (system_t *this,process_id_t pid,loc_id_t src,loc_id_t tgt,event_id_t event_id,
          attributes_t *attributes)

{
  bool bVar1;
  invalid_argument *piVar2;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  attributes_t *local_38;
  
  local_38 = attributes;
  bVar1 = processes_t::is_process(&this->super_processes_t,pid);
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&sStack_98,pid);
    std::operator+(&local_78,"Process ",&sStack_98);
    std::operator+(&local_58,&local_78," is not declared");
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_58);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = locs_t::is_location(&this->super_locs_t,src);
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&sStack_98,src);
    std::operator+(&local_78,"Source location ",&sStack_98);
    std::operator+(&local_58,&local_78," is not declared");
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_58);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = locs_t::is_location(&this->super_locs_t,tgt);
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&sStack_98,tgt);
    std::operator+(&local_78,"Traget location ",&sStack_98);
    std::operator+(&local_58,&local_78," is not declared");
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_58);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = events_t::is_event(&this->super_events_t,event_id);
  if (bVar1) {
    edges_t::add_edge(&this->super_edges_t,pid,src,tgt,event_id,local_38);
    return;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_98,event_id);
  std::operator+(&local_78,"Event ",&sStack_98);
  std::operator+(&local_58,&local_78," is not declared");
  std::invalid_argument::invalid_argument(piVar2,(string *)&local_58);
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void system_t::add_edge(tchecker::process_id_t pid, tchecker::loc_id_t src, tchecker::loc_id_t tgt,
                        tchecker::event_id_t event_id, tchecker::system::attributes_t const & attributes)
{
  if (!tchecker::system::processes_t::is_process(pid))
    throw std::invalid_argument("Process " + std::to_string(pid) + " is not declared");
  if (!tchecker::system::locs_t::is_location(src))
    throw std::invalid_argument("Source location " + std::to_string(src) + " is not declared");
  if (!tchecker::system::locs_t::is_location(tgt))
    throw std::invalid_argument("Traget location " + std::to_string(tgt) + " is not declared");
  if (!tchecker::system::events_t::is_event(event_id))
    throw std::invalid_argument("Event " + std::to_string(event_id) + " is not declared");
  tchecker::system::edges_t::add_edge(pid, src, tgt, event_id, attributes);
}